

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_type_test.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2aa72::FieldTypeTest_TestValueOfUnrecognisedCodeReturnsUnrecognisedFieldType_Test
::TestBody(FieldTypeTest_TestValueOfUnrecognisedCodeReturnsUnrecognisedFieldType_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_48 [3];
  Message local_30;
  FieldTypeEnum local_22 [2];
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  FieldTypeTest_TestValueOfUnrecognisedCodeReturnsUnrecognisedFieldType_Test *this_local;
  
  local_22[1] = 0x20;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  local_22[0] = bidfx_public_api::price::pixie::FieldTypeMethods::ValueOf(0x20);
  testing::internal::EqHelper<false>::
  Compare<bidfx_public_api::price::pixie::FieldTypeEnum,bidfx_public_api::price::pixie::FieldTypeEnum>
            ((EqHelper<false> *)local_20,"FieldTypeEnum::UNRECOGNISED",
             "FieldTypeMethods::ValueOf((int) FieldTypeEnum::UNRECOGNISED)",local_22 + 1,local_22);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(&local_30);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_type_test.cpp"
               ,0x23,message);
    testing::internal::AssertHelper::operator=(local_48,&local_30);
    testing::internal::AssertHelper::~AssertHelper(local_48);
    testing::Message::~Message(&local_30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  return;
}

Assistant:

TEST(FieldTypeTest, TestValueOfUnrecognisedCodeReturnsUnrecognisedFieldType)
{
    ASSERT_EQ(FieldTypeEnum::UNRECOGNISED, FieldTypeMethods::ValueOf((int) FieldTypeEnum::UNRECOGNISED));
}